

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

Parg * __thiscall
OB::Parg::info(Parg *this,string *_title,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *_text)

{
  info_pair local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)_title);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50.text,_text);
  std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>::
  emplace_back<OB::Parg::info_pair>(&this->info_,&local_50);
  info_pair::~info_pair(&local_50);
  return this;
}

Assistant:

Parg& info(std::string const _title, std::vector<std::string> const _text)
  {
    info_.emplace_back(info_pair{_title, _text});
    return *this;
  }